

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state,int32_t exponent)

{
  short sVar1;
  bool bVar2;
  long lVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  
  uVar8 = 0;
  uVar5 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar5 = uVar8;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar8 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar5 - exponent == 0 || (int)uVar5 < exponent) {
      uVar8 = exponent - uVar5;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar5 - exponent);
    }
  }
  bVar2 = Finalize<duckdb::DecimalCastData<short>,false>(state);
  if (bVar2) {
    if ((int)uVar8 < 0) {
      lVar3 = (long)(int)uVar8;
      uVar5 = (uint)(ushort)state->result;
      do {
        lVar3 = lVar3 + 1;
        sVar4 = (short)uVar5;
        uVar5 = (int)sVar4 / 10;
        if ((int)sVar4 + 9U < 0x13) break;
      } while (lVar3 != 0);
      sVar1 = (short)uVar5;
      state->result = sVar1;
      bVar2 = true;
      if (4 < (short)(sVar4 + sVar1 * -10)) {
        state->result = sVar1 + 1;
      }
    }
    else {
      bVar2 = true;
      if (uVar8 != 0) {
        uVar6 = (ulong)uVar8;
        bVar7 = state->digit_count;
        sVar4 = state->result;
        do {
          if (sVar4 == 0) {
            sVar4 = 0;
          }
          else {
            if ((uint)state->width - (uint)state->scale == (uint)bVar7) goto LAB_00d826b3;
            bVar7 = bVar7 + 1;
            state->digit_count = bVar7;
            if (0xccc < sVar4) goto LAB_00d826b3;
            sVar4 = sVar4 * 10;
            state->result = sVar4;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
  }
  else {
LAB_00d826b3:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}